

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think.c
# Opt level: O0

_Bool borg_think(void)

{
  loc_conflict grid;
  ulong uVar1;
  _Bool _Var2;
  errr eVar3;
  int iVar4;
  wchar_t wVar5;
  char *pcVar6;
  ushort **ppuVar7;
  char local_99;
  char local_98 [7];
  char c;
  char buf [128];
  int local_10;
  uint8_t t_a;
  int i;
  
  borg_notice_player();
  if ((borg_do_equip & 1U) == 0) {
    if ((borg_do_inven & 1U) == 0) {
      memcpy(safe_items,borg_items,
             (long)(int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size) * 0x388);
      if (((borg_save & 1U) == 0) || (_Var2 = borg_save_game(), !_Var2)) {
        if ((borg_think::justSaved & 1U) == 0) {
          eVar3 = borg_what_text(L'\0',L'\0',L'\n',(uint8_t *)(buf + 0x7f),local_98);
          if ((eVar3 == 0) && (iVar4 = strcmp(local_98,"(Equipment) "), iVar4 == 0)) {
            borg_keypress(0xe000);
            t_a = '\x01';
          }
          else {
            eVar3 = borg_what_text(L'\0',L'\0',L'\n',(uint8_t *)(buf + 0x7f),local_98);
            if ((eVar3 == 0) && (iVar4 = strcmp(local_98,"(Inventory) "), iVar4 == 0)) {
              borg_keypress(0xe000);
              t_a = '\x01';
            }
            else {
              eVar3 = borg_what_text(L'\0',L'\0',L'\x06',(uint8_t *)(buf + 0x7f),local_98);
              if ((eVar3 == 0) && (iVar4 = strcmp(local_98,"Wear o"), iVar4 == 0)) {
                borg_keypress(0xe000);
                t_a = '\x01';
              }
              else {
                if ((borg_do_spell & 1U) != 0) {
                  borg_cheat_spells();
                  borg_do_spell = false;
                }
                eVar3 = borg_what_text(L'7',L'\x01',L'\xfffffff4',(uint8_t *)(buf + 0x7f),local_98);
                if ((eVar3 == 0) && (iVar4 = strcmp(local_98,"Lv Mana Fail"), iVar4 == 0)) {
                  borg_keypress(0xe000);
                  t_a = '\x01';
                }
                else {
                  if (borg.trait[0x6b] != 0) {
                    if (borg_cfg[0x11] != 0) {
                      borg_write_map(false);
                      borg_oops("retire");
                    }
                    if (borg_cfg[0x13] != 0) {
                      borg_write_map(false);
                      borg_log_death();
                      borg_log_death_data();
                      reincarnate_borg();
                      borg_flush();
                    }
                  }
                  _Var2 = player_is_shapechanged(player);
                  if (_Var2) {
                    borg_keypress(0x76);
                    borg_keypress(0x72);
                    t_a = '\x01';
                  }
                  else {
                    eVar3 = borg_what_text(L'\x01',L'\x03',L'\x04',(uint8_t *)(buf + 0x7f),local_98)
                    ;
                    if ((eVar3 == 0) &&
                       ((iVar4 = strcmp(local_98,"Stor"), iVar4 == 0 ||
                        (iVar4 = strcmp(local_98,"Home"), iVar4 == 0)))) {
                      grid.x = (player->grid).x;
                      grid.y = (player->grid).y;
                      wVar5 = square_shopnum((chunk *)cave,grid);
                      shop_num = (int16_t)wVar5;
                      borg.goal.type = 0;
                      if (shop_num == 0) {
                        borg_food_onsale = L'\0';
                        borg_fuel_onsale = L'\0';
                      }
                      borg.trait[0x2d] = player->au;
                      borg_cheat_store();
                      borg_do_inven = true;
                      borg_do_equip = true;
                      borg_do_spell = true;
                      borg_notice(true);
                      borg.power = borg_power();
                      if ((borg_cancel & 1U) == 0) {
                        borg.in_shop = true;
                        t_a = borg_think_store();
                      }
                      else {
                        t_a = '\x01';
                      }
                    }
                    else {
                      w_y = Term->offset_y;
                      w_x = Term->offset_x;
                      borg_do_panel = false;
                      eVar3 = borg_what_text(L'\0',L'\0',L'\x10',(uint8_t *)(buf + 0x7f),local_98);
                      if ((eVar3 == 0) && (_Var2 = prefix(local_98,"Map sector "), _Var2)) {
                        uVar1 = (long)((Term->hgt - row_top_map[Term->sidebar_mode]) -
                                      row_bottom_map[Term->sidebar_mode]) /
                                (long)(int)(uint)tile_height;
                        w_y = (buf[4] + -0x30) *
                              (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 |
                                          uVar1 & 0xffffffff) / 2);
                        uVar1 = (long)((Term->wid - col_map[Term->sidebar_mode]) + -1) /
                                (long)(int)(uint)tile_width;
                        w_x = (buf[6] + -0x30) *
                              (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 |
                                          uVar1 & 0xffffffff) / 2);
                        borg_keypress(0xe000);
                        t_a = '\x01';
                      }
                      else if ((borg_do_panel & 1U) == 0) {
                        if ((borg_do_frame & 1U) != 0) {
                          borg_do_frame = false;
                          borg_notice_player();
                        }
                        borg_do_equip = true;
                        borg_do_inven = true;
                        borg_do_panel = true;
                        borg_do_frame = true;
                        borg_do_spell = true;
                        if (borg.trait[0x24] < borg.trait[0x23]) {
                          borg.trait[0x24] = borg.trait[0x23];
                        }
                        if (borg.trait[0x6a] < borg.trait[0x69]) {
                          borg.trait[0x6a] = borg.trait[0x69];
                        }
                        borg_t = borg_t + 1;
                        borg.time_this_panel = borg.time_this_panel + 1;
                        borg_notice(true);
                        borg_update();
                        borg.power = borg_power();
                        if ((borg_cancel & 1U) == 0) {
                          t_a = borg_think_dungeon();
                        }
                        else {
                          t_a = '\x01';
                        }
                      }
                      else {
                        borg_do_panel = false;
                        borg_keypress(0x4c);
                        t_a = '\x01';
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          memcpy(savefile,borg_think::svSavefile,0x400);
          borg_save_game();
          borg_think::justSaved = false;
          t_a = '\x01';
        }
      }
      else {
        borg_note("# Auto Save!");
        borg_save = false;
        if ((borg_cfg[0x1d] <= borg.trait[0x23]) ||
           (pcVar6 = strstr(player->died_from,"starvation"), pcVar6 != (char *)0x0)) {
          memcpy(borg_think::svSavefile,savefile,0x400);
          for (local_10 = 0; player->full_name[local_10] != '\0'; local_10 = local_10 + 1) {
            local_99 = player->full_name[local_10];
            ppuVar7 = __ctype_b_loc();
            if (((*ppuVar7)[(int)local_99] & 2) != 0) {
              quit_fmt("Illegal control char (0x%02X) in player name",(ulong)(uint)(int)local_99);
            }
            ppuVar7 = __ctype_b_loc();
            if ((((*ppuVar7)[(int)local_99] & 0x400) == 0) &&
               (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)local_99] & 0x800) == 0)) {
              local_99 = '_';
            }
            borg_think::svSavefile2[local_10] = local_99;
          }
          borg_think::svSavefile2[local_10] = '\0';
          path_build(savefile,0x400,ANGBAND_DIR_ARCHIVE,borg_think::svSavefile2);
          borg_think::justSaved = true;
        }
        t_a = '\x01';
      }
    }
    else {
      borg_do_inven = false;
      borg_cheat_inven();
      borg_cheat_store();
      t_a = '\0';
    }
  }
  else {
    borg_do_equip = false;
    borg_cheat_equip();
    t_a = '\0';
  }
  return (_Bool)t_a;
}

Assistant:

bool borg_think(void)
{
    int i;

    uint8_t t_a;

    char        buf[128];
    static char svSavefile[1024];
    static char svSavefile2[1024];
    static bool justSaved = false;

    /* Fill up part of the borg.trait[] array */
    (void)borg_notice_player();

    /*** Process inventory/equipment ***/

    /* Cheat */
    if (borg_do_equip) {
        /* Only do it once */
        borg_do_equip = false;

        /* Cheat the "equip" screen */
        borg_cheat_equip();

        /* Done */
        return false;
    }

    /* Cheat */
    if (borg_do_inven) {
        /* Only do it once */
        borg_do_inven = false;

        /* Cheat the "inven" screen */
        borg_cheat_inven();

        /* Do a quick cheat of the shops */
        borg_cheat_store();

        /* Done */
        return false;
    }

    /* save the items.  safe_items, from here on, should never be changed, */
    /* just copied from */
    memcpy(safe_items, borg_items, QUIVER_END * sizeof(borg_item));

    /* save now */
    if (borg_save && borg_save_game()) {
        /* Log */
        borg_note("# Auto Save!");

        borg_save = false;

        /* Create a scum file */
        if (borg.trait[BI_CLEVEL] >= borg_cfg[BORG_DUMP_LEVEL]
            || strstr(player->died_from, "starvation")) {
            memcpy(svSavefile, savefile, sizeof(savefile));
            /* Process the player name */
            for (i = 0; player->full_name[i]; i++) {
                char c = player->full_name[i];

                /* No control characters */
                if (iscntrl(c)) {
                    /* Illegal characters */
                    quit_fmt("Illegal control char (0x%02X) in player name", c);
                }

                /* Convert all non-alphanumeric symbols */
                if (!isalpha(c) && !isdigit(c))
                    c = '_';

                /* Build "file_name" */
                svSavefile2[i] = c;
            }
            svSavefile2[i] = 0;

            path_build(savefile, 1024, ANGBAND_DIR_ARCHIVE, svSavefile2);

            justSaved = true;
        }
        return true;
    }
    if (justSaved) {
        memcpy(savefile, svSavefile, sizeof(savefile));
        borg_save_game();
        justSaved = false;
        return true;
    }

    /* Parse "equip" mode */
    if ((0 == borg_what_text(0, 0, 10, &t_a, buf))
        && (streq(buf, "(Equipment) "))) {
        /* Parse the "equip" screen */
        /* borg_parse_equip(); */

        /* Leave this mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /* Parse "inven" mode */
    if ((0 == borg_what_text(0, 0, 10, &t_a, buf))
        && (streq(buf, "(Inventory) "))) {
        /* Parse the "inven" screen */
        /* borg_parse_inven(); */

        /* Leave this mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /* Parse "inven" mode */
    if ((0 == borg_what_text(0, 0, 6, &t_a, buf)) && (streq(buf, "Wear o"))) {
        /* Leave this mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /*** Process books/spells ***/
    if (borg_do_spell) {
        borg_cheat_spells();
        borg_do_spell = false;
    }


    /* Check for "browse" mode */
    if ((0 == borg_what_text(COL_SPELL, ROW_SPELL, -12, &t_a, buf))
        && (streq(buf, "Lv Mana Fail"))) {
        /* Parse the "spell" screen */
        /* borg_parse_spell(borg_do_spell_aux); */

        /* Advance to the next book */
        /* borg_do_spell_aux++; */

        /* Leave that mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /* If king, maybe retire. */
    if (borg.trait[BI_KING]) {
        /* Prepare to retire */
        if (borg_cfg[BORG_STOP_KING]) {
#ifndef BABLOS
            borg_write_map(false);
#endif /* bablos */
            borg_oops("retire");
        }
        /* Borg will be respawning */
        if (borg_cfg[BORG_RESPAWN_WINNERS]) {
#ifndef BABLOS
            borg_write_map(false);
#if 0
            /* Note the score */
            borg_enter_score();
#endif
            /* Write to log and borg.dat */
            borg_log_death();
            borg_log_death_data();

            /* respawn */
            reincarnate_borg();

            borg_flush();
#endif /* bablos */
        }
    }

    /* Hack -- always revert shapechanged players to normal form */
    if (player_is_shapechanged(player)) {
        /* it looks like throw is a good command that checks */
        /* your form without a prerequisite check */
        borg_keypress('v');
        borg_keypress('r');
        return true;
    }

    /*** Handle stores ***/

    /* Hack -- Check for being in a store CHEAT*/
    if ((0 == borg_what_text(1, 3, 4, &t_a, buf))
        && (streq(buf, "Stor") || streq(buf, "Home"))) {
        /* Cheat the store number */
        shop_num = square_shopnum(cave, player->grid);

        /* Clear the goal (the goal was probably going to a shop number) */
        borg.goal.type = 0;

        /* Hack -- Reset food counter for money scumming */
        if (shop_num == 0)
            borg_food_onsale = 0;

        /* Hack -- Reset fuel counter for money scumming */
        if (shop_num == 0)
            borg_fuel_onsale = 0;

        /* Extract the current gold (unless in home) */
        borg.trait[BI_GOLD] = (long)player->au;

        /* Cheat the store (or home) inventory (all pages) */
        borg_cheat_store();

        /* Recheck inventory */
        borg_do_inven = true;

        /* Recheck equipment */
        borg_do_equip = true;

        /* Recheck spells */
        borg_do_spell = true;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the current world */
        borg.power = borg_power();

        /* Hack -- allow user abort */
        if (borg_cancel)
            return true;

        /* Do not allow a user key to interrupt the borg while in a store */
        borg.in_shop = true;

        /* Think until done */
        return (borg_think_store());
    }

    /*** Determine panel ***/

    /* Hack -- cheat */
    w_y = Term->offset_y;
    w_x = Term->offset_x;

    /* Done */
    borg_do_panel = false;

    /* Hack -- Check for "sector" mode */
    if ((0 == borg_what_text(0, 0, 16, &t_a, buf))
        && (prefix(buf, "Map sector "))) {
        /* Hack -- get the panel info */
        w_y = (buf[12] - '0') * (SCREEN_HGT / 2);
        w_x = (buf[14] - '0') * (SCREEN_WID / 2);

        /* Leave panel mode */
        borg_keypress(ESCAPE);

        /* Done */
        return true;
    }

    /* Check panel */
    if (borg_do_panel) {
        /* Only do it once */
        borg_do_panel = false;

        /* Enter "panel" mode */
        borg_keypress('L');

        /* Done */
        return true;
    }

    /*** Analyze the Frame ***/

    /* Analyze the frame */
    if (borg_do_frame) {
        /* Only once */
        borg_do_frame = false;

        /* Analyze the "frame" */
        borg_notice_player();
    }

    /*** Re-activate Tests ***/

    /* Check equip again later */
    borg_do_equip = true;

    /* Check inven again later */
    borg_do_inven = true;

    /* Check panel again later */
    borg_do_panel = true;

    /* Check frame again later */
    borg_do_frame = true;

    /* Check spells again later */
    borg_do_spell = true;

    /*** Analyze status ***/

    /* Track best level */
    if (borg.trait[BI_CLEVEL] > borg.trait[BI_MAXCLEVEL])
        borg.trait[BI_MAXCLEVEL] = borg.trait[BI_CLEVEL];
    if (borg.trait[BI_CDEPTH] > borg.trait[BI_MAXDEPTH]) {
        borg.trait[BI_MAXDEPTH] = borg.trait[BI_CDEPTH];
    }

    /*** Think about it ***/

    /* Increment the clock */
    borg_t++;

    /* Increment the panel clock */
    borg.time_this_panel++;

    /* Examine the equipment/inventory */
    borg_notice(true);

    /* Examine the screen */
    borg_update();

    /* Evaluate the current world */
    borg.power = borg_power();

    /* Hack -- allow user abort */
    if (borg_cancel)
        return true;

    /* Do something */
    return (borg_think_dungeon());
}